

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan_state.cpp
# Opt level: O2

void __thiscall
duckdb::TableScanState::Initialize
          (TableScanState *this,vector<duckdb::StorageIndex,_true> *column_ids_p,
          optional_ptr<duckdb::ClientContext,_true> context,
          optional_ptr<duckdb::TableFilterSet,_true> table_filters,
          optional_ptr<duckdb::SampleOptions,_true> table_sampling)

{
  ClientContext *context_00;
  TableFilterSet *filters;
  SampleOptions *pSVar1;
  idx_t seed;
  double dVar2;
  optional_ptr<duckdb::SampleOptions,_true> local_40;
  optional_ptr<duckdb::TableFilterSet,_true> local_38;
  optional_ptr<duckdb::ClientContext,_true> local_30;
  
  local_40.ptr = table_sampling.ptr;
  local_38.ptr = table_filters.ptr;
  local_30.ptr = context.ptr;
  ::std::vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>::_M_move_assign
            (&(this->column_ids).
              super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>);
  if (table_filters.ptr != (TableFilterSet *)0x0) {
    context_00 = optional_ptr<duckdb::ClientContext,_true>::operator*(&local_30);
    filters = optional_ptr<duckdb::TableFilterSet,_true>::operator*(&local_38);
    ScanFilterInfo::Initialize(&this->filters,context_00,filters,&this->column_ids);
  }
  if (table_sampling.ptr != (SampleOptions *)0x0) {
    pSVar1 = optional_ptr<duckdb::SampleOptions,_true>::operator->(&local_40);
    (this->sampling_info).do_system_sample = pSVar1->method == SYSTEM_SAMPLE;
    pSVar1 = optional_ptr<duckdb::SampleOptions,_true>::operator->(&local_40);
    dVar2 = Value::GetValue<double>(&pSVar1->sample_size);
    (this->sampling_info).sample_rate = dVar2 / 100.0;
    pSVar1 = optional_ptr<duckdb::SampleOptions,_true>::operator->(&local_40);
    if ((pSVar1->seed).index != 0xffffffffffffffff) {
      pSVar1 = optional_ptr<duckdb::SampleOptions,_true>::operator->(&local_40);
      seed = optional_idx::GetIndex(&pSVar1->seed);
      RandomEngine::SetSeed(&(this->table_state).random,seed);
    }
  }
  return;
}

Assistant:

void TableScanState::Initialize(vector<StorageIndex> column_ids_p, optional_ptr<ClientContext> context,
                                optional_ptr<TableFilterSet> table_filters,
                                optional_ptr<SampleOptions> table_sampling) {
	this->column_ids = std::move(column_ids_p);
	if (table_filters) {
		filters.Initialize(*context, *table_filters, column_ids);
	}
	if (table_sampling) {
		sampling_info.do_system_sample = table_sampling->method == SampleMethod::SYSTEM_SAMPLE;
		sampling_info.sample_rate = table_sampling->sample_size.GetValue<double>() / 100.0;
		if (table_sampling->seed.IsValid()) {
			table_state.random.SetSeed(table_sampling->seed.GetIndex());
		}
	}
}